

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

string * __thiscall
CoreML::dataTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,ArrayFeatureType_ArrayDataType dataType)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = (int)this;
  if (iVar2 < 0x10040) {
    if (iVar2 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Float32";
      pcVar1 = "";
      goto LAB_005291cc;
    }
  }
  else {
    if (iVar2 == 0x10040) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Double";
      pcVar1 = "";
      goto LAB_005291cc;
    }
    if (iVar2 != 0x7fffffff) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Int32";
      pcVar1 = "";
      goto LAB_005291cc;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = "Invalid";
  pcVar1 = "";
LAB_005291cc:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string dataTypeToString(Specification::ArrayFeatureType_ArrayDataType dataType) {
        switch (dataType) {
            case Specification::ArrayFeatureType_ArrayDataType_INT32:
                return "Int32";
            case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                return "Double";
            case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                return "Float32";
            case Specification::ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE:
            case Specification::ArrayFeatureType_ArrayDataType_ArrayFeatureType_ArrayDataType_INT_MAX_SENTINEL_DO_NOT_USE_:
            case Specification::ArrayFeatureType_ArrayDataType_ArrayFeatureType_ArrayDataType_INT_MIN_SENTINEL_DO_NOT_USE_:
                return "Invalid";
        }
    }